

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_p.h
# Opt level: O2

bool __thiscall QLocaleId::acceptScriptTerritory(QLocaleId *this,QLocaleId other)

{
  if (other.territory_id != this->territory_id && this->territory_id != 0) {
    return false;
  }
  if (this->script_id != 0) {
    return other._0_4_ >> 0x10 == (uint)this->script_id;
  }
  return true;
}

Assistant:

[[nodiscard]] inline bool acceptScriptTerritory(QLocaleId other) const noexcept
    {
        return (!territory_id || other.territory_id == territory_id)
                && (!script_id || other.script_id == script_id);
    }